

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig
          (cmInstallImportedRuntimeArtifactsGenerator *this,ostream *os,string *config,Indent indent
          )

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  bool bVar2;
  TargetType TVar3;
  ulong uVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b08;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ac9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  iterator local_aa0;
  size_type local_a98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a90;
  string local_a78;
  int local_a58;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  iterator local_a28;
  size_type local_a20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a18;
  string local_a00;
  undefined1 local_9e0 [8];
  string bundlePath_1;
  string bundleName_1;
  string bundleDir_1;
  RegularExpressionMatch match_2;
  string local_770;
  char local_749;
  string local_748;
  undefined1 local_728 [8];
  string soNameFile;
  string soName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  iterator local_6b8;
  size_type local_6b0;
  undefined1 local_6a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  iterator local_660;
  size_type local_658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  string local_638;
  undefined1 local_618 [8];
  string frameworkPath;
  string frameworkName;
  string frameworkDir;
  RegularExpressionMatch match_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  iterator local_380;
  size_type local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  string local_358;
  int local_338;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  iterator local_308;
  size_type local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  string local_2e0;
  undefined1 local_2c0 [8];
  string bundlePath;
  string bundleName;
  string bundleDir;
  RegularExpressionMatch match;
  undefined1 local_48 [8];
  string location;
  string *config_local;
  ostream *os_local;
  cmInstallImportedRuntimeArtifactsGenerator *this_local;
  Indent indent_local;
  
  location.field_2._8_8_ = config;
  cmGeneratorTarget::GetFullPath((string *)local_48,this->Target,config,RuntimeBinaryArtifact,false)
  ;
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if (TVar3 == EXECUTABLE) {
    bVar2 = cmGeneratorTarget::IsBundleOnApple(this->Target);
    if (bVar2) {
      cmsys::RegularExpressionMatch::RegularExpressionMatch
                ((RegularExpressionMatch *)((long)&bundleDir.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::BundleRegularExpression,pcVar5,
                         (RegularExpressionMatch *)((long)&bundleDir.field_2 + 8));
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundleName.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir.field_2 + 8),1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundlePath.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir.field_2 + 8),2);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char_const(&)[5]>
                  ((string *)local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bundleName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bundlePath.field_2 + 8),(char (*) [5])".app");
        GetDestination(&local_2e0,this,(string *)location.field_2._8_8_);
        local_330 = &local_328;
        std::__cxx11::string::string((string *)local_330,(string *)local_2c0);
        local_308 = &local_328;
        local_300 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_331);
        __l_04._M_len = local_300;
        __l_04._M_array = local_308;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_2f8,__l_04,&local_331);
        bVar2 = this->Optional;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        local_338 = indent.Level;
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,&local_2e0,cmInstallType_DIRECTORY,&local_2f8,
                   (bool)(bVar2 & 1),(char *)0x0,pcVar5,(char *)0x0," USE_SOURCE_PERMISSIONS",indent
                   ,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_331);
        local_b08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308;
        do {
          local_b08 = local_b08 + -1;
          std::__cxx11::string::~string((string *)local_b08);
        } while (local_b08 != &local_328);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)local_2c0);
        std::__cxx11::string::~string((string *)(bundlePath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(bundleName.field_2._M_local_buf + 8));
      }
    }
    else {
      GetDestination(&local_358,this,(string *)location.field_2._8_8_);
      std::__cxx11::string::string((string *)&local_3a0,(string *)local_48);
      local_380 = &local_3a0;
      local_378 = 1;
      paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&match_1.searchstring + 7);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(paVar1);
      __l_03._M_len = local_378;
      __l_03._M_array = local_380;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_370,__l_03,paVar1);
      bVar2 = this->Optional;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      match_1.searchstring._0_4_ = indent.Level;
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_358,cmInstallType_EXECUTABLE,&local_370,
                 (bool)(bVar2 & 1),pcVar5,(char *)0x0,(char *)0x0,(char *)0x0,indent,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_370);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&match_1.searchstring + 7));
      local_b60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_380;
      do {
        local_b60 = local_b60 + -1;
        std::__cxx11::string::~string((string *)local_b60);
      } while (local_b60 != &local_3a0);
      std::__cxx11::string::~string((string *)&local_358);
    }
  }
  else if (TVar3 == SHARED_LIBRARY) {
    bVar2 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
    if (bVar2) {
      cmsys::RegularExpressionMatch::RegularExpressionMatch
                ((RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                         pcVar5,(RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8));
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&frameworkName.field_2 + 8),
                   (RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8),1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&frameworkPath.field_2 + 8),
                   (RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8),2);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char_const(&)[11]>
                  ((string *)local_618,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&frameworkName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&frameworkPath.field_2 + 8),(char (*) [11])".framework");
        GetDestination(&local_638,this,(string *)location.field_2._8_8_);
        std::__cxx11::string::string((string *)&local_680,(string *)local_618);
        local_660 = &local_680;
        local_658 = 1;
        paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(paVar1);
        __l_02._M_len = local_658;
        __l_02._M_array = local_660;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_650,__l_02,paVar1);
        bVar2 = this->Optional;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = indent.Level;
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,&local_638,cmInstallType_DIRECTORY,&local_650,
                   (bool)(bVar2 & 1),(char *)0x0,pcVar5,(char *)0x0," USE_SOURCE_PERMISSIONS",indent
                   ,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_650);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_bc0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_660;
        do {
          local_bc0 = local_bc0 + -1;
          std::__cxx11::string::~string((string *)local_bc0);
        } while (local_bc0 != &local_680);
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)local_618);
        std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(frameworkName.field_2._M_local_buf + 8));
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_6d8,(string *)local_48);
      local_6b8 = &local_6d8;
      local_6b0 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(soName.field_2._M_local_buf + 0xf));
      __l_01._M_len = local_6b0;
      __l_01._M_array = local_6b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_6a8,__l_01,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(soName.field_2._M_local_buf + 0xf));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(soName.field_2._M_local_buf + 0xf));
      local_c08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6b8;
      do {
        local_c08 = local_c08 + -1;
        std::__cxx11::string::~string((string *)local_c08);
      } while (local_c08 != &local_6d8);
      cmGeneratorTarget::GetSOName
                ((string *)((long)&soNameFile.field_2 + 8),this->Target,
                 (string *)location.field_2._8_8_,RuntimeBinaryArtifact);
      cmGeneratorTarget::GetDirectory
                (&local_748,this->Target,(string *)location.field_2._8_8_,RuntimeBinaryArtifact);
      local_749 = '/';
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string&>
                ((string *)local_728,&local_748,&local_749,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&soNameFile.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_748);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_728,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48), bVar2)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_6a8,(value_type *)local_728);
      }
      GetDestination(&local_770,this,(string *)location.field_2._8_8_);
      bVar2 = this->Optional;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_770,cmInstallType_SHARED_LIBRARY,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6a8,(bool)(bVar2 & 1),pcVar5,(char *)0x0,(char *)0x0,(char *)0x0,indent,
                 (char *)0x0);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string((string *)local_728);
      std::__cxx11::string::~string((string *)(soNameFile.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6a8);
    }
  }
  else {
    if (TVar3 != MODULE_LIBRARY) {
      __assert_fail("false && \"This should never happen\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallImportedRuntimeArtifactsGenerator.cxx"
                    ,0x8f,
                    "virtual void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                   );
    }
    bVar2 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
    if (bVar2) {
      cmsys::RegularExpressionMatch::RegularExpressionMatch
                ((RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::CFBundleRegularExpression,
                         pcVar5,(RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8));
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundleName_1.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8),1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundlePath_1.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8),2);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char_const(&)[8]>
                  ((string *)local_9e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bundleName_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bundlePath_1.field_2 + 8),(char (*) [8])".bundle");
        GetDestination(&local_a00,this,(string *)location.field_2._8_8_);
        local_a50 = &local_a48;
        std::__cxx11::string::string((string *)local_a50,(string *)local_9e0);
        local_a28 = &local_a48;
        local_a20 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_a51);
        __l_00._M_len = local_a20;
        __l_00._M_array = local_a28;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a18,__l_00,&local_a51);
        bVar2 = this->Optional;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        local_a58 = indent.Level;
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,&local_a00,cmInstallType_DIRECTORY,&local_a18,
                   (bool)(bVar2 & 1),(char *)0x0,pcVar5,(char *)0x0," USE_SOURCE_PERMISSIONS",indent
                   ,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a18);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_a51);
        local_c70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a28;
        do {
          local_c70 = local_c70 + -1;
          std::__cxx11::string::~string((string *)local_c70);
        } while (local_c70 != &local_a48);
        std::__cxx11::string::~string((string *)&local_a00);
        std::__cxx11::string::~string((string *)local_9e0);
        std::__cxx11::string::~string((string *)(bundlePath_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(bundleName_1.field_2._M_local_buf + 8));
      }
    }
    else {
      GetDestination(&local_a78,this,(string *)location.field_2._8_8_);
      local_ac8 = &local_ac0;
      std::__cxx11::string::string((string *)local_ac8,(string *)local_48);
      local_aa0 = &local_ac0;
      local_a98 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_ac9);
      __l._M_len = local_a98;
      __l._M_array = local_aa0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a90,__l,&local_ac9);
      bVar2 = this->Optional;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_a78,cmInstallType_MODULE_LIBRARY,
                 &local_a90,(bool)(bVar2 & 1),pcVar5,(char *)0x0,(char *)0x0,(char *)0x0,indent,
                 (char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a90);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_ac9);
      local_cc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_aa0;
      do {
        local_cc8 = local_cc8 + -1;
        std::__cxx11::string::~string((string *)local_cc8);
      } while (local_cc8 != &local_ac0);
      std::__cxx11::string::~string((string *)&local_a78);
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto location = this->Target->GetFullPath(config);

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      if (this->Target->IsBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (BundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".app");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_EXECUTABLE, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::SHARED_LIBRARY:
      if (this->Target->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(location.c_str(), match)) {
          auto frameworkDir = match.match(1);
          auto frameworkName = match.match(2);
          auto frameworkPath =
            cmStrCat(frameworkDir, frameworkName, ".framework");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { frameworkPath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        std::vector<std::string> files{ location };
        auto soName = this->Target->GetSOName(config);
        auto soNameFile =
          cmStrCat(this->Target->GetDirectory(config), '/', soName);
        if (!soName.empty() && soNameFile != location) {
          files.push_back(soNameFile);
        }
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_SHARED_LIBRARY, files,
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      if (this->Target->IsCFBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (CFBundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".bundle");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_MODULE_LIBRARY, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    default:
      assert(false && "This should never happen");
      break;
  }
}